

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPipeConnection.cxx
# Opt level: O2

void __thiscall
cmPipeConnection::cmPipeConnection
          (cmPipeConnection *this,string *name,cmConnectionBufferStrategy *bufferStrategy)

{
  cmEventBasedConnection::cmEventBasedConnection(&this->super_cmEventBasedConnection,bufferStrategy)
  ;
  (this->super_cmEventBasedConnection).super_cmConnection._vptr_cmConnection =
       (_func_int **)&PTR_WriteData_005c5a90;
  std::__cxx11::string::string((string *)&this->PipeName,(string *)name);
  (this->ServerPipe).super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->ServerPipe).super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

cmPipeConnection::cmPipeConnection(std::string name,
                                   cmConnectionBufferStrategy* bufferStrategy)
  : cmEventBasedConnection(bufferStrategy)
  , PipeName(std::move(name))
{
}